

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

bool gvr::anon_unknown_1::operator<(VertexNormalIndex *a,VertexNormalIndex *b)

{
  float eps;
  VertexNormalIndex *b_local;
  VertexNormalIndex *a_local;
  
  if (a->x < b->x) {
    return true;
  }
  if ((a->x == b->x) && (!NAN(a->x) && !NAN(b->x))) {
    if (a->y < b->y) {
      return true;
    }
    if ((a->y == b->y) && (!NAN(a->y) && !NAN(b->y))) {
      if (a->z < b->z) {
        return true;
      }
      if ((a->z == b->z) && (!NAN(a->z) && !NAN(b->z))) {
        if (a->nx < b->nx - 0.1) {
          return true;
        }
        if (a->nx < b->nx + 0.1) {
          if (a->ny < b->ny - 0.1) {
            return true;
          }
          if ((a->ny < b->ny + 0.1) && (a->nz < b->nz - 0.1)) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator<(const VertexNormalIndex &a, const VertexNormalIndex &b)
{
  float eps=0.1f;

  if (a.x < b.x)
  {
    return true;
  }
  else if (a.x == b.x)
  {
    if (a.y < b.y)
    {
      return true;
    }
    else if (a.y == b.y)
    {
      if (a.z < b.z)
      {
        return true;
      }
      else if (a.z == b.z)
      {
        if (a.nx < b.nx-eps)
        {
          return true;
        }
        else if (a.nx < b.nx+eps)
        {
          if (a.ny < b.ny-eps)
          {
            return true;
          }
          else if (a.ny < b.ny+eps)
          {
            if (a.nz < b.nz-eps)
            {
              return true;
            }
          }
        }
      }
    }
  }

  return false;
}